

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cpp
# Opt level: O2

bool __thiscall
DescriptorCache::GetCachedParentExtPubKey
          (DescriptorCache *this,uint32_t key_exp_pos,CExtPubKey *xpub)

{
  const_iterator cVar1;
  long lVar2;
  uchar *puVar3;
  long in_FS_OFFSET;
  byte bVar4;
  uint32_t key_exp_pos_local;
  long local_10;
  
  bVar4 = 0;
  local_10 = *(long *)(in_FS_OFFSET + 0x28);
  key_exp_pos_local = key_exp_pos;
  cVar1 = std::
          _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_CExtPubKey>,_std::allocator<std::pair<const_unsigned_int,_CExtPubKey>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
          ::find(&(this->m_parent_xpubs)._M_h,&key_exp_pos_local);
  if (cVar1.super__Node_iterator_base<std::pair<const_unsigned_int,_CExtPubKey>,_false>._M_cur !=
      (__node_type *)0x0) {
    puVar3 = (uchar *)((long)cVar1.
                             super__Node_iterator_base<std::pair<const_unsigned_int,_CExtPubKey>,_false>
                             ._M_cur + 0xc);
    for (lVar2 = 0x71; lVar2 != 0; lVar2 = lVar2 + -1) {
      xpub->version[0] = *puVar3;
      puVar3 = puVar3 + (ulong)bVar4 * -2 + 1;
      xpub = (CExtPubKey *)((long)xpub + (ulong)bVar4 * -2 + 1);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_10) {
    return cVar1.super__Node_iterator_base<std::pair<const_unsigned_int,_CExtPubKey>,_false>._M_cur
           != (__node_type *)0x0;
  }
  __stack_chk_fail();
}

Assistant:

bool DescriptorCache::GetCachedParentExtPubKey(uint32_t key_exp_pos, CExtPubKey& xpub) const
{
    const auto& it = m_parent_xpubs.find(key_exp_pos);
    if (it == m_parent_xpubs.end()) return false;
    xpub = it->second;
    return true;
}